

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-bs.cpp
# Opt level: O3

int vertexTest(float x,float y)

{
  int iVar1;
  float_t *pfVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  pfVar2 = &g_patch.vertices[0].y;
  uVar3 = 0;
  do {
    fVar5 = ((vec4 *)(pfVar2 + -1))->x - ((x + x) / 1680.0 + -1.0);
    fVar6 = *pfVar2 - (((1050.0 - y) + (1050.0 - y)) / 1050.0 + -1.0);
    fVar5 = SQRT(fVar5 * fVar5 + fVar6 * fVar6);
    uVar4 = uVar3 + 1;
    if (2 < uVar3) break;
    pfVar2 = pfVar2 + 4;
    uVar3 = uVar4;
  } while (0.01904762 <= fVar5);
  iVar1 = -1;
  if (fVar5 < 0.01904762) {
    iVar1 = (int)uVar4 + -1;
  }
  return iVar1;
}

Assistant:

int vertexTest(float x, float y)
{
    dja::vec2 res = dja::vec2(VIEWER_DEFAULT_WIDTH, VIEWER_DEFAULT_HEIGHT);
    dja::vec2 ndc = 2.0f * dja::vec2(x, VIEWER_DEFAULT_HEIGHT - y) / res - dja::vec2(1.0f);
    int idx = -1;

    for (int i = 0; i < BUFFER_SIZE(g_patch.vertices) && idx == -1; ++i) {
        dja::vec4 p4 = g_patch.vertices[i];
        dja::vec2 p2 = dja::vec2(p4.x, p4.y);
        float nrm = dja::norm(p2 - ndc);

        if (nrm < 32.f / res.x)
            idx = i;
    }

    return idx;
}